

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_ps.c
# Opt level: O1

RK_S32 mpp_hevc_decode_nal_pps(HEVCContext *s)

{
  long lVar1;
  RK_U8 RVar2;
  BitReadCtx_t *bitctx;
  HEVCSPS *pHVar3;
  MppDecHwCap *pMVar4;
  void *pvVar5;
  RK_U32 *pRVar6;
  MPP_RET MVar7;
  int iVar8;
  RK_S32 RVar9;
  HEVCPPS *pps;
  RK_U32 *pRVar10;
  uint uVar11;
  int iVar12;
  RK_U32 RVar13;
  long lVar14;
  char *pcVar15;
  ScalingList *sl;
  uint uVar16;
  ScalingList *pSVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  HEVCPPS *pHVar21;
  bool bVar22;
  RK_U32 _out;
  HEVCSPS *local_48;
  ulong local_40;
  ScalingList *local_38;
  
  bitctx = &s->HEVClc->gb;
  pps = (HEVCPPS *)mpp_osal_calloc("mpp_hevc_decode_nal_pps",0x690);
  if (((byte)h265d_debug & 1) != 0) {
    _mpp_log_l(4,"H265PARSER_PS","Decoding PPS\n",(char *)0x0);
  }
  if (pps == (HEVCPPS *)0x0) {
    return -0x3ee;
  }
  MVar7 = mpp_read_ue(bitctx,&_out);
  RVar13 = _out;
  bitctx->ret = MVar7;
  if (MVar7 == MPP_OK) {
    sl = (ScalingList *)(ulong)_out;
    if (_out < 0x40) {
      pHVar21 = (HEVCPPS *)s->pps_list[(long)sl];
      if ((HEVCPPS *)s->pps_list[(long)sl] == (HEVCPPS *)0x0) {
        pHVar21 = pps;
      }
      pps->pps_id = _out;
      pps->num_tile_columns = 1;
      pps->num_tile_rows = 1;
      pps->uniform_spacing_flag = '\x01';
      pps->loop_filter_across_tiles_enabled_flag = '\x01';
      pps->disable_dbf = '\0';
      pps->beta_offset = 0;
      pps->tc_offset = 0;
      MVar7 = mpp_read_ue(bitctx,&_out);
      bitctx->ret = MVar7;
      iVar8 = 6;
      if (MVar7 == MPP_OK) {
        pps->sps_id = _out;
        iVar8 = 0;
      }
      if (iVar8 == 6) goto LAB_001a59c2;
      if (iVar8 != 0) {
        return RVar13;
      }
      pSVar17 = (ScalingList *)(ulong)pps->sps_id;
      local_38 = sl;
      if (pSVar17 < (ScalingList *)0x10) {
        pHVar3 = (HEVCSPS *)s->sps_list[(long)pSVar17];
        if (pHVar3 != (HEVCSPS *)0x0) {
          local_48 = pHVar3;
          if (((byte)h265d_debug & 1) != 0) {
            _mpp_log_l(4,"H265PARSER_PS","Decoding PPS 1\n",(char *)0x0);
          }
          MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
          bitctx->ret = MVar7;
          iVar8 = 6;
          if (MVar7 == MPP_OK) {
            pps->dependent_slice_segments_enabled_flag = (RK_U8)_out;
            iVar8 = 0;
          }
          if (iVar8 != 6) {
            if (iVar8 != 0) {
              return RVar13;
            }
            MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
            bitctx->ret = MVar7;
            iVar8 = 6;
            if (MVar7 == MPP_OK) {
              pps->output_flag_present_flag = (RK_U8)_out;
              iVar8 = 0;
            }
            if (iVar8 != 6) {
              if (iVar8 != 0) {
                return RVar13;
              }
              MVar7 = mpp_read_bits(bitctx,3,(RK_S32 *)&_out);
              bitctx->ret = MVar7;
              iVar8 = 6;
              if (MVar7 == MPP_OK) {
                pps->num_extra_slice_header_bits = _out;
                iVar8 = 0;
              }
              if (iVar8 != 6) {
                if (iVar8 != 0) {
                  return RVar13;
                }
                MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                bitctx->ret = MVar7;
                iVar8 = 6;
                if (MVar7 == MPP_OK) {
                  pps->sign_data_hiding_flag = (RK_U8)_out;
                  iVar8 = 0;
                }
                if (iVar8 != 6) {
                  if (iVar8 != 0) {
                    return RVar13;
                  }
                  MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                  bitctx->ret = MVar7;
                  iVar8 = 6;
                  if (MVar7 == MPP_OK) {
                    pps->cabac_init_present_flag = (RK_U8)_out;
                    iVar8 = 0;
                  }
                  if (iVar8 != 6) {
                    if (iVar8 != 0) {
                      return RVar13;
                    }
                    MVar7 = mpp_read_ue(bitctx,&_out);
                    bitctx->ret = MVar7;
                    iVar8 = 6;
                    if (MVar7 == MPP_OK) {
                      pps->num_ref_idx_l0_default_active = _out;
                      iVar8 = 0;
                    }
                    if (iVar8 != 6) {
                      if (iVar8 != 0) {
                        return RVar13;
                      }
                      pps->num_ref_idx_l0_default_active = pps->num_ref_idx_l0_default_active + 1;
                      MVar7 = mpp_read_ue(bitctx,&_out);
                      bitctx->ret = MVar7;
                      iVar8 = 6;
                      if (MVar7 == MPP_OK) {
                        pps->num_ref_idx_l1_default_active = _out;
                        iVar8 = 0;
                      }
                      if (iVar8 != 6) {
                        if (iVar8 != 0) {
                          return RVar13;
                        }
                        pps->num_ref_idx_l1_default_active = pps->num_ref_idx_l1_default_active + 1;
                        MVar7 = mpp_read_se(bitctx,(RK_S32 *)&_out);
                        bitctx->ret = MVar7;
                        iVar8 = 6;
                        if (MVar7 == MPP_OK) {
                          pps->pic_init_qp_minus26 = _out;
                          iVar8 = 0;
                        }
                        if (iVar8 != 6) {
                          if (iVar8 != 0) {
                            return RVar13;
                          }
                          MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                          bitctx->ret = MVar7;
                          iVar8 = 6;
                          if (MVar7 == MPP_OK) {
                            pps->constrained_intra_pred_flag = (RK_U8)_out;
                            iVar8 = 0;
                          }
                          if (iVar8 != 6) {
                            if (iVar8 != 0) {
                              return RVar13;
                            }
                            MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                            bitctx->ret = MVar7;
                            iVar8 = 6;
                            if (MVar7 == MPP_OK) {
                              pps->transform_skip_enabled_flag = (RK_U8)_out;
                              iVar8 = 0;
                            }
                            if (iVar8 != 6) {
                              if (iVar8 != 0) {
                                return RVar13;
                              }
                              MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                              bitctx->ret = MVar7;
                              iVar8 = 6;
                              if (MVar7 == MPP_OK) {
                                pps->cu_qp_delta_enabled_flag = (RK_U8)_out;
                                iVar8 = 0;
                              }
                              if (iVar8 != 6) {
                                if (iVar8 != 0) {
                                  return RVar13;
                                }
                                pps->diff_cu_qp_delta_depth = 0;
                                if (pps->cu_qp_delta_enabled_flag != '\0') {
                                  MVar7 = mpp_read_ue(bitctx,&_out);
                                  bitctx->ret = MVar7;
                                  iVar8 = 6;
                                  if (MVar7 == MPP_OK) {
                                    pps->diff_cu_qp_delta_depth = _out;
                                    iVar8 = 0;
                                  }
                                  if (iVar8 == 6) goto LAB_001a59c2;
                                  if (iVar8 != 0) {
                                    return RVar13;
                                  }
                                }
                                MVar7 = mpp_read_se(bitctx,(RK_S32 *)&_out);
                                bitctx->ret = MVar7;
                                iVar8 = 6;
                                if (MVar7 == MPP_OK) {
                                  pps->cb_qp_offset = _out;
                                  iVar8 = 0;
                                }
                                if (iVar8 != 6) {
                                  if (iVar8 != 0) {
                                    return RVar13;
                                  }
                                  if (pps->cb_qp_offset - 0xdU < 0xffffffe7) {
                                    pcVar15 = "pps_cb_qp_offset out of range: %d\n";
                                    pSVar17 = (ScalingList *)(ulong)(uint)pps->cb_qp_offset;
                                    goto LAB_001a4865;
                                  }
                                  MVar7 = mpp_read_se(bitctx,(RK_S32 *)&_out);
                                  bitctx->ret = MVar7;
                                  iVar8 = 6;
                                  if (MVar7 == MPP_OK) {
                                    pps->cr_qp_offset = _out;
                                    iVar8 = 0;
                                  }
                                  if (iVar8 != 6) {
                                    if (iVar8 != 0) {
                                      return RVar13;
                                    }
                                    if (pps->cr_qp_offset - 0xdU < 0xffffffe7) {
                                      pcVar15 = "pps_cr_qp_offset out of range: %d\n";
                                      pSVar17 = (ScalingList *)(ulong)(uint)pps->cr_qp_offset;
                                      goto LAB_001a4865;
                                    }
                                    MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                    bitctx->ret = MVar7;
                                    iVar8 = 6;
                                    if (MVar7 == MPP_OK) {
                                      pps->pic_slice_level_chroma_qp_offsets_present_flag =
                                           (RK_U8)_out;
                                      iVar8 = 0;
                                    }
                                    if (iVar8 != 6) {
                                      if (iVar8 != 0) {
                                        return RVar13;
                                      }
                                      MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                      bitctx->ret = MVar7;
                                      iVar8 = 6;
                                      if (MVar7 == MPP_OK) {
                                        pps->weighted_pred_flag = (RK_U8)_out;
                                        iVar8 = 0;
                                      }
                                      if (iVar8 != 6) {
                                        if (iVar8 != 0) {
                                          return RVar13;
                                        }
                                        MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                        bitctx->ret = MVar7;
                                        iVar8 = 6;
                                        if (MVar7 == MPP_OK) {
                                          pps->weighted_bipred_flag = (RK_U8)_out;
                                          iVar8 = 0;
                                        }
                                        if (iVar8 != 6) {
                                          if (iVar8 != 0) {
                                            return RVar13;
                                          }
                                          MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                          bitctx->ret = MVar7;
                                          iVar8 = 6;
                                          if (MVar7 == MPP_OK) {
                                            pps->transquant_bypass_enable_flag = (RK_U8)_out;
                                            iVar8 = 0;
                                          }
                                          if (iVar8 != 6) {
                                            if (iVar8 != 0) {
                                              return RVar13;
                                            }
                                            MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                            bitctx->ret = MVar7;
                                            iVar8 = 6;
                                            if (MVar7 == MPP_OK) {
                                              pps->tiles_enabled_flag = (RK_U8)_out;
                                              iVar8 = 0;
                                            }
                                            if (iVar8 != 6) {
                                              if (iVar8 != 0) {
                                                return RVar13;
                                              }
                                              MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                              bitctx->ret = MVar7;
                                              iVar8 = 6;
                                              if (MVar7 == MPP_OK) {
                                                pps->entropy_coding_sync_enabled_flag = (RK_U8)_out;
                                                iVar8 = 0;
                                              }
                                              if (iVar8 != 6) {
                                                if (iVar8 != 0) {
                                                  return RVar13;
                                                }
                                                pMVar4 = s->h265dctx->hw_info;
                                                if (pMVar4 != (MppDecHwCap *)0x0) {
                                                  uVar11 = (uint)*(undefined8 *)&pMVar4->field_0x4;
                                                  if ((uVar11 >> 0x14 & 1) == 0) {
                                                    iVar8 = local_48->height * local_48->width;
                                                    iVar12 = (uVar11 & 0xe00000) * 0x20;
                                                    if (iVar8 == iVar12 ||
                                                        SBORROW4(iVar8,iVar12) !=
                                                        (int)(iVar8 + (uVar11 & 0xe00000) * -0x20) <
                                                        0) {
LAB_001a4f51:
                                                      iVar8 = 0;
                                                    }
                                                    else {
                                                      _mpp_log_l(2,"H265PARSER_PS",
                                                                                                                                  
                                                  "cannot support %dx%d, max solution %dx%d\n",
                                                  (char *)0x0,(ulong)(uint)local_48->width,
                                                  (ulong)(uint)local_48->height,0x2000,0x2000);
                                                  iVar8 = 7;
                                                  }
                                                  }
                                                  else {
                                                    RVar2 = pps->tiles_enabled_flag;
                                                    if ((uVar11 >> 0xd & 1) == 0) {
                                                      uVar16 = 0x440;
                                                      if (RVar2 == '\0') {
                                                        uVar16 = 0x780;
                                                      }
                                                      uVar19 = 0x900;
                                                      if (RVar2 == '\0') {
                                                        uVar19 = 0x1000;
                                                      }
                                                      bVar22 = (uVar11 >> 0xc & 1) == 0;
                                                      uVar11 = 0x1000;
                                                      if (bVar22) {
                                                        uVar11 = 0x780;
                                                      }
                                                      uVar18 = (ulong)uVar11;
                                                      if (bVar22) {
                                                        uVar19 = uVar16;
                                                      }
                                                      uVar20 = (ulong)uVar19;
                                                    }
                                                    else {
                                                      uVar18 = 0x2000;
                                                      uVar20 = 0x10e0;
                                                      if (RVar2 == '\0') {
                                                        uVar20 = 0x2000;
                                                      }
                                                    }
                                                    uVar11 = local_48->width;
                                                    iVar8 = (int)uVar18;
                                                    if (((iVar8 < (int)uVar11) ||
                                                        ((int)uVar20 < local_48->height &&
                                                         RVar2 != '\0')) ||
                                                       (iVar8 * iVar8 <
                                                        (int)(local_48->height * uVar11))) {
                                                      sl = (ScalingList *)0x0;
                                                      _mpp_log_l(2,"H265PARSER_PS",
                                                                                                                                  
                                                  "cannot support %dx%d, max solution %dx%d\n",
                                                  (char *)0x0,(ulong)uVar11,
                                                  (ulong)(uint)local_48->height,uVar18,uVar20);
                                                  iVar8 = 7;
                                                  }
                                                  else {
                                                    iVar8 = 0;
                                                    sl = (ScalingList *)
                                                         CONCAT71((uint7)(uint3)(RVar13 >> 8),1);
                                                  }
                                                  if ((char)sl != '\0') goto LAB_001a4f51;
                                                  }
                                                  if (iVar8 == 7) {
                                                    iVar8 = 0;
                                                    goto LAB_001a59c7;
                                                  }
                                                  if (iVar8 != 0) {
                                                    return (RK_S32)sl;
                                                  }
                                                }
                                                if (pps->tiles_enabled_flag == '\0')
                                                goto LAB_001a5117;
                                                MVar7 = mpp_read_ue(bitctx,&_out);
                                                bitctx->ret = MVar7;
                                                iVar8 = 6;
                                                if (MVar7 == MPP_OK) {
                                                  pps->num_tile_columns = _out;
                                                  iVar8 = 0;
                                                }
                                                if (iVar8 != 6) {
                                                  if (iVar8 != 0) {
                                                    return (RK_S32)sl;
                                                  }
                                                  pps->num_tile_columns = pps->num_tile_columns + 1;
                                                  MVar7 = mpp_read_ue(bitctx,&_out);
                                                  bitctx->ret = MVar7;
                                                  iVar8 = 6;
                                                  if (MVar7 == MPP_OK) {
                                                    pps->num_tile_rows = _out;
                                                    iVar8 = 0;
                                                  }
                                                  if (iVar8 != 6) {
                                                    if (iVar8 != 0) {
                                                      return (RK_S32)sl;
                                                    }
                                                    iVar12 = pps->num_tile_columns;
                                                    uVar11 = pps->num_tile_rows;
                                                    iVar8 = uVar11 + 1;
                                                    pps->num_tile_rows = iVar8;
                                                    if ((iVar12 == 0) || (local_48->width <= iVar12)
                                                       ) {
                                                      pSVar17 = (ScalingList *)(ulong)(iVar12 - 1);
                                                      pcVar15 = 
                                                  "num_tile_columns_minus1 out of range: %d\n";
                                                  }
                                                  else {
                                                    if ((iVar8 != 0) && (iVar8 < local_48->height))
                                                    {
                                                      iVar12 = iVar12 * 4;
                                                      if ((pHVar21->bufs).column_width_size < iVar12
                                                         ) {
                                                        pRVar10 = (RK_U32 *)
                                                                  mpp_osal_malloc(
                                                  "mpp_hevc_decode_nal_pps",(long)iVar12);
                                                  (pHVar21->bufs).column_width = pRVar10;
                                                  (pHVar21->bufs).column_width_size = iVar12;
                                                  }
                                                  iVar8 = pps->num_tile_rows * 4;
                                                  if ((pHVar21->bufs).row_height_size < iVar8) {
                                                    pRVar10 = (RK_U32 *)
                                                              mpp_osal_malloc(
                                                  "mpp_hevc_decode_nal_pps",(long)iVar8);
                                                  (pHVar21->bufs).row_height = pRVar10;
                                                  (pHVar21->bufs).row_height_size = iVar8;
                                                  }
                                                  sl = (ScalingList *)0xfffffc12;
                                                  iVar8 = -0x3ee;
                                                  if (((pHVar21->bufs).column_width == (RK_U32 *)0x0
                                                      ) || ((pHVar21->bufs).row_height ==
                                                            (RK_U32 *)0x0)) goto LAB_001a59c7;
                                                  MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                                  bitctx->ret = MVar7;
                                                  iVar8 = 6;
                                                  if (MVar7 == MPP_OK) {
                                                    pps->uniform_spacing_flag = (RK_U8)_out;
                                                    iVar8 = 0;
                                                  }
                                                  if (iVar8 != 6) {
                                                    if (iVar8 != 0) {
                                                      return -0x3ee;
                                                    }
                                                    if (pps->uniform_spacing_flag == '\0') {
                                                      if (pps->num_tile_columns < 2) {
                                                        uVar18 = (ulong)(pps->num_tile_columns - 1);
                                                        local_40 = 0;
                                                      }
                                                      else {
                                                        lVar14 = 0;
                                                        local_40 = 0;
                                                        do {
                                                          MVar7 = mpp_read_ue(bitctx,&_out);
                                                          bitctx->ret = MVar7;
                                                          if (MVar7 != MPP_OK) goto LAB_001a5941;
                                                          (pHVar21->bufs).column_width[lVar14] =
                                                               _out;
                                                          pRVar10 = (pHVar21->bufs).column_width;
                                                          RVar13 = pRVar10[lVar14];
                                                          pRVar10[lVar14] = RVar13 + 1;
                                                          local_40 = (ulong)((int)local_40 + RVar13
                                                                            + 1);
                                                          lVar14 = lVar14 + 1;
                                                          uVar18 = (long)pps->num_tile_columns - 1;
                                                        } while (lVar14 < (long)uVar18);
                                                      }
                                                      RVar13 = local_48->ctb_width - (int)local_40;
                                                      if (RVar13 == 0 ||
                                                          local_48->ctb_width < (int)local_40) {
                                                        pcVar15 = "Invalid tile widths.\n";
                                                      }
                                                      else {
                                                        (pHVar21->bufs).column_width[(int)uVar18] =
                                                             RVar13;
                                                        if (pps->num_tile_rows < 2) {
                                                          uVar18 = (ulong)(pps->num_tile_rows - 1);
                                                          local_40 = 0;
                                                        }
                                                        else {
                                                          lVar14 = 0;
                                                          local_40 = 0;
                                                          do {
                                                            MVar7 = mpp_read_ue(bitctx,&_out);
                                                            bitctx->ret = MVar7;
                                                            if (MVar7 != MPP_OK) goto LAB_001a5941;
                                                            (pHVar21->bufs).row_height[lVar14] =
                                                                 _out;
                                                            pRVar10 = (pHVar21->bufs).row_height;
                                                            RVar13 = pRVar10[lVar14];
                                                            pRVar10[lVar14] = RVar13 + 1;
                                                            local_40 = (ulong)((int)local_40 +
                                                                               RVar13 + 1);
                                                            lVar14 = lVar14 + 1;
                                                            uVar18 = (long)pps->num_tile_rows - 1;
                                                          } while (lVar14 < (long)uVar18);
                                                        }
                                                        RVar13 = local_48->ctb_height -
                                                                 (int)local_40;
                                                        if (RVar13 != 0 &&
                                                            (int)local_40 <= local_48->ctb_height) {
                                                          (pHVar21->bufs).row_height[(int)uVar18] =
                                                               RVar13;
                                                          sl = (ScalingList *)0x0;
                                                          iVar12 = 0;
                                                          goto LAB_001a59ae;
                                                        }
                                                        pcVar15 = "Invalid tile heights.\n";
                                                      }
                                                      _mpp_log_l(2,"H265PARSER_PS",pcVar15,
                                                                 (char *)0x0);
                                                      iVar12 = 7;
                                                      sl = (ScalingList *)0xfffffc14;
                                                      goto LAB_001a59ae;
                                                    }
                                                    goto LAB_001a50dd;
                                                  }
                                                  goto LAB_001a59c2;
                                                  }
                                                  pcVar15 = 
                                                  "num_tile_rows_minus1 out of range: %d\n";
                                                  pSVar17 = (ScalingList *)(ulong)uVar11;
                                                  }
                                                  goto LAB_001a4865;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          goto LAB_001a59c2;
        }
        pcVar15 = "SPS %u does not exist.\n";
      }
      else {
        pcVar15 = "SPS id out of range: %d\n";
      }
    }
    else {
      pcVar15 = "PPS id out of range: %d\n";
      pSVar17 = sl;
    }
LAB_001a4865:
    _mpp_log_l(2,"H265PARSER_PS",pcVar15,(char *)0x0,pSVar17);
  }
LAB_001a59c2:
  iVar8 = -0x3ec;
LAB_001a59c7:
  mpp_hevc_pps_free((RK_U8 *)pps);
  return iVar8;
LAB_001a5941:
  iVar12 = 6;
  sl = (ScalingList *)0x0;
LAB_001a59ae:
  iVar8 = (int)sl;
  if (iVar12 == 7) goto LAB_001a59c7;
  if (iVar12 != 6) {
    if (iVar12 != 0) {
      return iVar8;
    }
LAB_001a50dd:
    MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
    bitctx->ret = MVar7;
    iVar8 = 6;
    if (MVar7 == MPP_OK) {
      pps->loop_filter_across_tiles_enabled_flag = (RK_U8)_out;
      iVar8 = 0;
    }
    if (iVar8 != 6) {
      if (iVar8 != 0) {
        return (RK_S32)sl;
      }
LAB_001a5117:
      RVar9 = (RK_S32)sl;
      MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
      bitctx->ret = MVar7;
      iVar8 = 6;
      if (MVar7 == MPP_OK) {
        pps->seq_loop_filter_across_slices_enabled_flag = (RK_U8)_out;
        iVar8 = 0;
      }
      if (iVar8 != 6) {
        if (iVar8 != 0) {
          return RVar9;
        }
        MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
        bitctx->ret = MVar7;
        iVar8 = 6;
        if (MVar7 == MPP_OK) {
          pps->deblocking_filter_control_present_flag = (RK_U8)_out;
          iVar8 = 0;
        }
        if (iVar8 != 6) {
          if (iVar8 != 0) {
            return RVar9;
          }
          if (pps->deblocking_filter_control_present_flag == '\0') {
LAB_001a520f:
            MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
            bitctx->ret = MVar7;
            iVar8 = 6;
            if (MVar7 == MPP_OK) {
              pps->scaling_list_data_present_flag = (RK_U8)_out;
              iVar8 = 0;
            }
            if (iVar8 != 6) {
              if (iVar8 != 0) {
                return RVar9;
              }
              if (pps->scaling_list_data_present_flag != '\0') {
                sl = &pps->scaling_list;
                set_default_scaling_list_data(sl);
                iVar8 = scaling_list_data(s,sl,local_48);
                if (iVar8 < 0) goto LAB_001a59c7;
                *(undefined1 *)((long)s->vps_list + (long)(local_38 + 0x4a) + 0x4c) = 1;
              }
              RVar9 = (RK_S32)sl;
              if (((byte)h265d_debug & 8) != 0) {
                _mpp_log_l(4,"H265PARSER_PS","num bit left %d",(char *)0x0,
                           (ulong)(uint)bitctx->num_remaining_bits_in_curr_byte_);
              }
              MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
              bitctx->ret = MVar7;
              iVar8 = 6;
              if (MVar7 == MPP_OK) {
                pps->lists_modification_present_flag = (RK_U8)_out;
                iVar8 = 0;
              }
              if (iVar8 != 6) {
                if (iVar8 != 0) {
                  return RVar9;
                }
                if (((byte)h265d_debug & 8) != 0) {
                  _mpp_log_l(4,"H265PARSER_PS","num bit left %d",(char *)0x0,
                             (ulong)(uint)bitctx->num_remaining_bits_in_curr_byte_);
                }
                MVar7 = mpp_read_ue(bitctx,&_out);
                bitctx->ret = MVar7;
                iVar8 = 6;
                if (MVar7 == MPP_OK) {
                  pps->log2_parallel_merge_level = _out;
                  iVar8 = 0;
                }
                if (iVar8 != 6) {
                  if (iVar8 != 0) {
                    return RVar9;
                  }
                  if (((byte)h265d_debug & 8) != 0) {
                    _mpp_log_l(4,"H265PARSER_PS","num bit left %d",(char *)0x0,
                               (ulong)(uint)bitctx->num_remaining_bits_in_curr_byte_);
                  }
                  uVar11 = pps->log2_parallel_merge_level;
                  iVar8 = uVar11 + 2;
                  pps->log2_parallel_merge_level = iVar8;
                  if (local_48->log2_ctb_size < iVar8) {
                    pcVar15 = "log2_parallel_merge_level_minus2 out of range: %d\n";
                    pSVar17 = (ScalingList *)(ulong)uVar11;
                    goto LAB_001a4865;
                  }
                  MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                  bitctx->ret = MVar7;
                  iVar8 = 6;
                  if (MVar7 == MPP_OK) {
                    pps->slice_header_extension_present_flag = (RK_U8)_out;
                    iVar8 = 0;
                  }
                  if (iVar8 != 6) {
                    if (iVar8 != 0) {
                      return RVar9;
                    }
                    MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                    bitctx->ret = MVar7;
                    iVar8 = 6;
                    if (MVar7 == MPP_OK) {
                      pps->pps_extension_flag = (RK_U8)_out;
                      iVar8 = 0;
                    }
                    if (iVar8 != 6) {
                      if (iVar8 != 0) {
                        return RVar9;
                      }
                      if (((byte)h265d_debug & 8) != 0) {
                        _mpp_log_l(4,"H265PARSER_PS","pps_extension_flag %d",(char *)0x0,
                                   (ulong)pps->pps_extension_flag);
                      }
                      if (pps->pps_extension_flag == '\0') {
LAB_001a5619:
                        pvVar5 = s->h265dctx->compare_info;
                        if (pvVar5 != (void *)0x0) {
                          lVar14 = (long)local_38 * 0x690;
                          _mpp_log_l(4,"H265PARSER_PS","compare pps in",(char *)0x0);
                          RVar9 = compare_pps((HEVCPPS *)((long)pvVar5 + lVar14 + 0x39b80),pps);
                          if (RVar9 < 0) {
                            _mpp_log_l(2,"H265PARSER_PS","compare pps with openhevc error found",
                                       (char *)0x0);
                            _mpp_log_l(2,"H265PARSER_PS","Assertion %s failed at %s:%d\n",
                                       (char *)0x0,"0","mpp_hevc_decode_nal_pps",0x88b);
                            if ((mpp_debug._3_1_ & 0x10) != 0) {
                              abort();
                            }
                          }
                          else {
                            _mpp_log_l(4,"H265PARSER_PS","compare pps ok",(char *)0x0);
                          }
                          if (RVar9 < 0) {
                            return -1;
                          }
                        }
                        if (pps->uniform_spacing_flag == '\0') {
LAB_001a58d7:
                          if (s->pps_list[(long)local_38] == (RK_U8 *)0x0) {
                            s->pps_list[(long)local_38] = (RK_U8 *)pps;
                          }
                          else {
                            memcpy(s->pps_list[(long)local_38],pps,0x678);
                            mpp_hevc_pps_free((RK_U8 *)pps);
                          }
                          s->ps_need_upate = '\x01';
                          if (s->pps_list[(long)local_38] == (RK_U8 *)0x0) {
                            return 0;
                          }
                          s->pps_list_of_updated[(long)local_38] = '\x01';
                          return 0;
                        }
                        iVar8 = pps->num_tile_columns * 4;
                        if ((pHVar21->bufs).column_width_size < iVar8) {
                          pRVar10 = (RK_U32 *)mpp_osal_malloc("mpp_hevc_decode_nal_pps",(long)iVar8)
                          ;
                          (pHVar21->bufs).column_width = pRVar10;
                          (pHVar21->bufs).column_width_size = iVar8;
                        }
                        iVar8 = pps->num_tile_rows * 4;
                        if ((pHVar21->bufs).row_height_size < iVar8) {
                          pRVar10 = (RK_U32 *)mpp_osal_malloc("mpp_hevc_decode_nal_pps",(long)iVar8)
                          ;
                          (pHVar21->bufs).row_height = pRVar10;
                          (pHVar21->bufs).row_height_size = iVar8;
                        }
                        pRVar10 = (pHVar21->bufs).column_width;
                        iVar8 = -0x3ee;
                        if ((pRVar10 != (RK_U32 *)0x0) &&
                           (pRVar6 = (pHVar21->bufs).row_height, pRVar6 != (RK_U32 *)0x0)) {
                          uVar18 = (ulong)(uint)pps->num_tile_columns;
                          if (0 < pps->num_tile_columns) {
                            lVar14 = 0;
                            do {
                              lVar1 = lVar14 + 1;
                              pRVar10[lVar14] =
                                   ((int)lVar1 * local_48->ctb_width) / (int)uVar18 -
                                   ((int)lVar14 * local_48->ctb_width) / (int)uVar18;
                              uVar18 = (ulong)pps->num_tile_columns;
                              lVar14 = lVar1;
                            } while (lVar1 < (long)uVar18);
                          }
                          uVar18 = (ulong)(uint)pps->num_tile_rows;
                          if (0 < pps->num_tile_rows) {
                            lVar14 = 0;
                            do {
                              lVar1 = lVar14 + 1;
                              pRVar6[lVar14] =
                                   ((int)lVar1 * local_48->ctb_height) / (int)uVar18 -
                                   ((int)lVar14 * local_48->ctb_height) / (int)uVar18;
                              uVar18 = (ulong)pps->num_tile_rows;
                              lVar14 = lVar1;
                            } while (lVar1 < (long)uVar18);
                          }
                          goto LAB_001a58d7;
                        }
                        goto LAB_001a59c7;
                      }
                      MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                      bitctx->ret = MVar7;
                      iVar8 = 6;
                      if (MVar7 == MPP_OK) {
                        pps->pps_range_extensions_flag = (RK_U8)_out;
                        iVar8 = 0;
                      }
                      if (iVar8 != 6) {
                        if (iVar8 != 0) {
                          return RVar9;
                        }
                        MVar7 = mpp_skip_longbits(bitctx,7);
                        bitctx->ret = MVar7;
                        if (MVar7 == MPP_OK) goto LAB_001a5619;
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
            bitctx->ret = MVar7;
            iVar8 = 6;
            if (MVar7 == MPP_OK) {
              pps->deblocking_filter_override_enabled_flag = (RK_U8)_out;
              iVar8 = 0;
            }
            if (iVar8 != 6) {
              if (iVar8 != 0) {
                return RVar9;
              }
              MVar7 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
              bitctx->ret = MVar7;
              iVar8 = 6;
              if (MVar7 == MPP_OK) {
                pps->disable_dbf = (RK_U8)_out;
                iVar8 = 0;
              }
              if (iVar8 != 6) {
                if (iVar8 != 0) {
                  return RVar9;
                }
                if (pps->disable_dbf != '\0') goto LAB_001a520f;
                MVar7 = mpp_read_se(bitctx,(RK_S32 *)&_out);
                bitctx->ret = MVar7;
                iVar8 = 6;
                if (MVar7 == MPP_OK) {
                  pps->beta_offset = _out;
                  iVar8 = 0;
                }
                if (iVar8 != 6) {
                  if (iVar8 != 0) {
                    return RVar9;
                  }
                  pps->beta_offset = pps->beta_offset << 1;
                  MVar7 = mpp_read_se(bitctx,(RK_S32 *)&_out);
                  bitctx->ret = MVar7;
                  iVar8 = 6;
                  if (MVar7 == MPP_OK) {
                    pps->tc_offset = _out;
                    iVar8 = 0;
                  }
                  if (iVar8 != 6) {
                    if (iVar8 != 0) {
                      return RVar9;
                    }
                    uVar11 = pps->tc_offset;
                    pps->tc_offset = uVar11 * 2;
                    if (pps->beta_offset - 0xeU < 0xffffffe5) {
                      pSVar17 = (ScalingList *)(ulong)(uint)(pps->beta_offset / 2);
                      pcVar15 = "pps_beta_offset_div2 out of range: %d\n";
                    }
                    else {
                      if (0xfffffff2 < uVar11 - 7) goto LAB_001a520f;
                      pcVar15 = "pps_tc_offset_div2 out of range: %d\n";
                      pSVar17 = (ScalingList *)(ulong)uVar11;
                    }
                    goto LAB_001a4865;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  goto LAB_001a59c2;
}

Assistant:

int mpp_hevc_decode_nal_pps(HEVCContext *s)
{
    BitReadCtx_t *gb = &s->HEVClc->gb;
    HEVCSPS *sps = NULL;
    HEVCPPS *pps = mpp_calloc(HEVCPPS, 1);
    HevcPpsBufInfo *bufs = NULL;
    RK_S32 buf_size = 0;
    RK_U32 pps_id = 0;
    RK_S32 ret = 0;
    RK_S32 i;

    h265d_dbg(H265D_DBG_FUNCTION, "Decoding PPS\n");

    if (!pps)
        return MPP_ERR_NOMEM;

    // Coded parameters
    READ_UE(gb, &pps_id);
    if (pps_id >= MAX_PPS_COUNT) {
        mpp_err( "PPS id out of range: %d\n", pps_id);
        ret =  MPP_ERR_STREAM;
        goto err;
    }

    if (s->pps_list[pps_id]) {
        bufs = &(((HEVCPPS *)s->pps_list[pps_id])->bufs);
    } else {
        bufs = &pps->bufs;
    }

    pps->pps_id = pps_id;
    // Default values
    pps->loop_filter_across_tiles_enabled_flag = 1;
    pps->num_tile_columns                      = 1;
    pps->num_tile_rows                         = 1;
    pps->uniform_spacing_flag                  = 1;
    pps->disable_dbf                           = 0;
    pps->beta_offset                           = 0;
    pps->tc_offset                             = 0;

    READ_UE(gb, &pps->sps_id);
    if (pps->sps_id >= MAX_SPS_COUNT) {
        mpp_err( "SPS id out of range: %d\n", pps->sps_id);
        ret =  MPP_ERR_STREAM;
        goto err;
    }
    if (!s->sps_list[pps->sps_id]) {
        mpp_err( "SPS %u does not exist.\n", pps->sps_id);
        ret =  MPP_ERR_STREAM;
        goto err;
    }
    sps = (HEVCSPS *)s->sps_list[pps->sps_id];

    h265d_dbg(H265D_DBG_FUNCTION, "Decoding PPS 1\n");
    READ_ONEBIT(gb, &pps->dependent_slice_segments_enabled_flag);
    READ_ONEBIT(gb, &pps->output_flag_present_flag );
    READ_BITS(gb, 3, &pps->num_extra_slice_header_bits);

    READ_ONEBIT(gb, &pps->sign_data_hiding_flag);

    READ_ONEBIT(gb, &pps->cabac_init_present_flag);

    READ_UE(gb, &pps->num_ref_idx_l0_default_active);
    pps->num_ref_idx_l0_default_active +=  1;
    READ_UE(gb, &pps->num_ref_idx_l1_default_active);
    pps->num_ref_idx_l1_default_active += 1;

    READ_SE(gb, &pps->pic_init_qp_minus26);

    READ_ONEBIT(gb, & pps->constrained_intra_pred_flag);
    READ_ONEBIT(gb, &pps->transform_skip_enabled_flag);

    READ_ONEBIT(gb, &pps->cu_qp_delta_enabled_flag);
    pps->diff_cu_qp_delta_depth   = 0;
    if (pps->cu_qp_delta_enabled_flag)
        READ_UE(gb, &pps->diff_cu_qp_delta_depth);

    READ_SE(gb, &pps->cb_qp_offset);
    if (pps->cb_qp_offset < -12 || pps->cb_qp_offset > 12) {
        mpp_err( "pps_cb_qp_offset out of range: %d\n",
                 pps->cb_qp_offset);
        ret =  MPP_ERR_STREAM;
        goto err;
    }
    READ_SE(gb, &pps->cr_qp_offset);
    if (pps->cr_qp_offset < -12 || pps->cr_qp_offset > 12) {
        mpp_err( "pps_cr_qp_offset out of range: %d\n",
                 pps->cr_qp_offset);
        ret =  MPP_ERR_STREAM;
        goto err;
    }
    READ_ONEBIT(gb, &pps->pic_slice_level_chroma_qp_offsets_present_flag);

    READ_ONEBIT(gb, &pps->weighted_pred_flag);

    READ_ONEBIT(gb, &pps->weighted_bipred_flag);

    READ_ONEBIT(gb, &pps->transquant_bypass_enable_flag);
    READ_ONEBIT(gb, &pps->tiles_enabled_flag);
    READ_ONEBIT(gb, &pps->entropy_coding_sync_enabled_flag);

    // check support solution
    if (s->h265dctx->hw_info) {
        const MppDecHwCap *hw_info = s->h265dctx->hw_info;

        if (hw_info->cap_lmt_linebuf) {
            RK_S32 max_supt_width = PIXW_1080P;
            RK_S32 max_supt_height = pps->tiles_enabled_flag ? PIXH_1080P : PIXW_1080P;

            if (hw_info && hw_info->cap_8k) {
                max_supt_width = PIXW_8Kx4K;
                max_supt_height = pps->tiles_enabled_flag ? PIXH_8Kx4K : PIXW_8Kx4K;
            } else if (hw_info && hw_info->cap_4k) {
                max_supt_width = PIXW_4Kx2K;
                max_supt_height = pps->tiles_enabled_flag ? PIXH_4Kx2K : PIXW_4Kx2K;
            }

            if (sps->width > max_supt_width || (sps->height > max_supt_height && pps->tiles_enabled_flag)
                || sps->width * sps->height > max_supt_width * max_supt_width) {
                mpp_err("cannot support %dx%d, max solution %dx%d\n",
                        sps->width, sps->height, max_supt_width, max_supt_height);
                goto err;
            }
        } else {
            if (sps->width * sps->height > PIXW_8Kx4K * PIXW_8Kx4K * hw_info->cap_core_num) {
                mpp_err("cannot support %dx%d, max solution %dx%d\n",
                        sps->width, sps->height, PIXW_8Kx4K, PIXW_8Kx4K);
                goto err;
            }
        }
    }

    if (pps->tiles_enabled_flag) {
        READ_UE(gb, &pps->num_tile_columns);
        pps->num_tile_columns += 1;
        READ_UE(gb, &pps->num_tile_rows);
        pps->num_tile_rows += 1;
        if (pps->num_tile_columns == 0 ||
            pps->num_tile_columns >= sps->width) {
            mpp_err( "num_tile_columns_minus1 out of range: %d\n",
                     pps->num_tile_columns - 1);
            ret =  MPP_ERR_STREAM;
            goto err;
        }
        if (pps->num_tile_rows == 0 ||
            pps->num_tile_rows >= sps->height) {
            mpp_err( "num_tile_rows_minus1 out of range: %d\n",
                     pps->num_tile_rows - 1);
            ret =  MPP_ERR_STREAM;
            goto err;
        }

        buf_size = pps->num_tile_columns * sizeof(RK_U32);
        if (bufs->column_width_size < buf_size) {
            bufs->column_width = mpp_malloc_size(RK_U32, buf_size);
            bufs->column_width_size = buf_size;
        }

        buf_size = pps->num_tile_rows * sizeof(RK_U32);
        if (bufs->row_height_size < buf_size) {
            bufs->row_height = mpp_malloc_size(RK_U32, buf_size);
            bufs->row_height_size = buf_size;
        }

        if (!bufs->column_width || !bufs->row_height) {
            ret = MPP_ERR_NOMEM;
            goto err;
        }

        READ_ONEBIT(gb, &pps->uniform_spacing_flag );
        if (!pps->uniform_spacing_flag) {
            RK_S32 sum = 0;
            for (i = 0; i < pps->num_tile_columns - 1; i++) {
                READ_UE(gb, &bufs->column_width[i]);
                bufs->column_width[i] += 1;
                sum                   += bufs->column_width[i];
            }
            if (sum >= sps->ctb_width) {
                mpp_err( "Invalid tile widths.\n");
                ret =  MPP_ERR_STREAM;
                goto err;
            }
            bufs->column_width[pps->num_tile_columns - 1] = sps->ctb_width - sum;

            sum = 0;
            for (i = 0; i < pps->num_tile_rows - 1; i++) {
                READ_UE(gb, &bufs->row_height[i]);
                bufs->row_height[i] += 1;
                sum                 += bufs->row_height[i];
            }
            if (sum >= sps->ctb_height) {
                mpp_err( "Invalid tile heights.\n");
                ret =  MPP_ERR_STREAM;
                goto err;
            }
            bufs->row_height[pps->num_tile_rows - 1] = sps->ctb_height - sum;
        }
        READ_ONEBIT(gb, &pps->loop_filter_across_tiles_enabled_flag);
    }

    READ_ONEBIT(gb, &pps->seq_loop_filter_across_slices_enabled_flag);
    READ_ONEBIT(gb, &pps->deblocking_filter_control_present_flag);
    if (pps->deblocking_filter_control_present_flag) {
        READ_ONEBIT(gb, &pps->deblocking_filter_override_enabled_flag);
        READ_ONEBIT(gb, & pps->disable_dbf);
        if (!pps->disable_dbf) {
            READ_SE(gb, &pps->beta_offset);
            pps->beta_offset = pps->beta_offset * 2;
            READ_SE(gb, &pps->tc_offset);
            pps->tc_offset = pps->tc_offset * 2;
            if (pps->beta_offset / 2 < -6 || pps->beta_offset / 2 > 6) {
                mpp_err( "pps_beta_offset_div2 out of range: %d\n",
                         pps->beta_offset / 2);
                ret =  MPP_ERR_STREAM;
                goto err;
            }
            if (pps->tc_offset / 2 < -6 || pps->tc_offset / 2 > 6) {
                mpp_err( "pps_tc_offset_div2 out of range: %d\n",
                         pps->tc_offset / 2);
                ret =  MPP_ERR_STREAM;
                goto err;
            }
        }
    }

    READ_ONEBIT(gb, &pps->scaling_list_data_present_flag);
    if (pps->scaling_list_data_present_flag) {
        set_default_scaling_list_data(&pps->scaling_list);
        ret = scaling_list_data(s, &pps->scaling_list, sps);

        if (ret < 0)
            goto err;
        s->scaling_list_listen[pps_id + 16] = 1;
    }

    h265d_dbg(H265D_DBG_PPS, "num bit left %d", gb->num_remaining_bits_in_curr_byte_);
    READ_ONEBIT(gb, & pps->lists_modification_present_flag);


    h265d_dbg(H265D_DBG_PPS, "num bit left %d", gb->num_remaining_bits_in_curr_byte_);
    READ_UE(gb, &pps->log2_parallel_merge_level);

    h265d_dbg(H265D_DBG_PPS, "num bit left %d", gb->num_remaining_bits_in_curr_byte_);
    pps->log2_parallel_merge_level += 2;
    if (pps->log2_parallel_merge_level > sps->log2_ctb_size) {
        mpp_err( "log2_parallel_merge_level_minus2 out of range: %d\n",
                 pps->log2_parallel_merge_level - 2);
        ret =  MPP_ERR_STREAM;
        goto err;
    }
    READ_ONEBIT(gb, &pps->slice_header_extension_present_flag);
    READ_ONEBIT(gb, &pps->pps_extension_flag);
    h265d_dbg(H265D_DBG_PPS, "pps_extension_flag %d", pps->pps_extension_flag);
    if (pps->pps_extension_flag) {
        READ_ONEBIT(gb, &pps->pps_range_extensions_flag);
        SKIP_BITS(gb, 7); // pps_extension_7bits
    }

    if (s->h265dctx->compare_info != NULL) {
        CurrentFameInf_t *info = (CurrentFameInf_t *)s->h265dctx->compare_info;
        HEVCPPS *openhevc_pps = (HEVCPPS*)&info->pps[pps_id];
        mpp_log("compare pps in");
        if (compare_pps(openhevc_pps, (HEVCPPS*)pps) < 0) {
            mpp_err("compare pps with openhevc error found");
            mpp_assert(0);
            return -1;
        }
        mpp_log("compare pps ok");
    }

    // Inferred parameters
    if (pps->uniform_spacing_flag) {
        buf_size = pps->num_tile_columns * sizeof(RK_U32);
        if (bufs->column_width_size < buf_size) {
            bufs->column_width = mpp_malloc_size(RK_U32, buf_size);
            bufs->column_width_size = buf_size;
        }

        buf_size = pps->num_tile_rows * sizeof(RK_U32);
        if (bufs->row_height_size < buf_size) {
            bufs->row_height = mpp_malloc_size(RK_U32, buf_size);
            bufs->row_height_size = buf_size;
        }
        if (!bufs->column_width || !bufs->row_height) {
            ret = MPP_ERR_NOMEM;
            goto err;
        }

        for (i = 0; i < pps->num_tile_columns; i++) {
            bufs->column_width[i] = ((i + 1) * sps->ctb_width) / pps->num_tile_columns -
                                    (i * sps->ctb_width) / pps->num_tile_columns;
        }

        for (i = 0; i < pps->num_tile_rows; i++) {
            bufs->row_height[i] = ((i + 1) * sps->ctb_height) / pps->num_tile_rows -
                                  (i * sps->ctb_height) / pps->num_tile_rows;
        }
    }

    if (s->pps_list[pps_id]) {
        memcpy(s->pps_list[pps_id], pps, sizeof(*pps) - sizeof(pps->bufs));
        mpp_hevc_pps_free((RK_U8 *)pps);
    } else {
        s->pps_list[pps_id] = (RK_U8 *)pps;
    }
    s->ps_need_upate = 1;

    if (s->pps_list[pps_id])
        s->pps_list_of_updated[pps_id] = 1;

    return 0;
__BITREAD_ERR:
    ret = MPP_ERR_STREAM;
err:
    if (pps)
        mpp_hevc_pps_free((RK_U8 *)pps);

    return ret;
}